

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tbl.hpp
# Opt level: O2

bool __thiscall
Tbl::Table<std::allocator<char>_>::ReadRow
          (Table<std::allocator<char>_> *this,string_view text,const_iterator *current,
          char delimiter,Format format)

{
  size_type sVar1;
  char *pcVar2;
  __hashtable *__h;
  String str;
  size_type local_a0;
  String local_78;
  _Variant_storage<false,_long,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  
  local_a0 = 0;
  do {
    if (*current == text._M_str + text._M_len) {
LAB_00155a56:
      AdvanceToNextLine(this,text,current);
      return local_a0 == (this->m_columnMap)._M_h._M_element_count;
    }
    Table<std::allocator<char>>::ParseCell_abi_cxx11_
              (&local_78,(Table<std::allocator<char>> *)this,text,delimiter,current);
    if (local_a0 == 0) {
      sVar1 = (this->m_rowMap)._M_h._M_element_count;
      std::__cxx11::string::string((string *)&local_58,(string *)&local_78);
      local_58._32_8_ = sVar1;
      std::
      _Hashtable<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::_M_emplace<std::pair<std::__cxx11::string_const,unsigned_long>>
                ((_Hashtable<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)&this->m_rowMap,&local_58);
      std::__cxx11::string::~string((string *)&local_58);
      std::__detail::__variant::_Variant_storage<false,long,double,std::__cxx11::string>::
      _Variant_storage<2ul,std::__cxx11::string&>
                ((_Variant_storage<false,long,double,std::__cxx11::string> *)&local_58,&local_78);
      std::
      vector<std::variant<long,double,std::__cxx11::string>,std::allocator<std::variant<long,double,std::__cxx11::string>>>
      ::emplace_back<std::variant<long,double,std::__cxx11::string>>
                ((vector<std::variant<long,double,std::__cxx11::string>,std::allocator<std::variant<long,double,std::__cxx11::string>>>
                  *)this,(variant<long,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_58);
    }
    else {
      ParseData((TableData *)&local_58,this,&local_78,format);
      std::
      vector<std::variant<long,double,std::__cxx11::string>,std::allocator<std::variant<long,double,std::__cxx11::string>>>
      ::emplace_back<std::variant<long,double,std::__cxx11::string>>
                ((vector<std::variant<long,double,std::__cxx11::string>,std::allocator<std::variant<long,double,std::__cxx11::string>>>
                  *)this,(variant<long,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_58);
    }
    std::__detail::__variant::
    _Variant_storage<false,_long,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~_Variant_storage(&local_58);
    pcVar2 = *current;
    if (((pcVar2 == text._M_str + text._M_len) || (*pcVar2 == '\n')) || (*pcVar2 == '\r')) {
      std::__cxx11::string::~string((string *)&local_78);
      local_a0 = local_a0 + 1;
      goto LAB_00155a56;
    }
    *current = pcVar2 + 1;
    std::__cxx11::string::~string((string *)&local_78);
    local_a0 = local_a0 + 1;
  } while( true );
}

Assistant:

bool ReadRow(std::string_view text, std::string_view::const_iterator & current, char delimiter, Format format)
		{
			// Track column data
			size_t column = 0;
			while (current != text.end())
			{
				auto str = ParseCell(text, delimiter, current);
				if (column == 0)
				{
					m_rowMap.insert({ str, m_rowMap.size() });
					m_tableData.push_back(str);
				}
				else
					m_tableData.push_back(ParseData(str, format));
				++column;
				if (current == text.end() || IsLineEnd(current))
					break;
				++current;
			}
			AdvanceToNextLine(text, current);
			return column == GetNumColumns();
		}